

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

ArrayPtr<const_unsigned_char> * __thiscall
kj::Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
          (Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_> *this,
          ArrayPtr<const_unsigned_char> *row)

{
  bool bVar1;
  uint skip;
  size_t pos;
  ArrayPtr<const_unsigned_char> *pAVar2;
  Maybe<unsigned_long> local_28;
  ArrayPtr<const_unsigned_char> *local_18;
  ArrayPtr<const_unsigned_char> *row_local;
  Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_> *this_local;
  
  local_18 = row;
  row_local = (ArrayPtr<const_unsigned_char> *)this;
  pos = Vector<kj::ArrayPtr<const_unsigned_char>_>::size(&this->rows);
  pAVar2 = local_18;
  skip = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  Impl<0UL,_false>::insert((Impl<0UL,_false> *)&local_28,this,pos,pAVar2,skip);
  bVar1 = Maybe<unsigned_long>::operator==(&local_28);
  Maybe<unsigned_long>::~Maybe(&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pAVar2 = mv<kj::ArrayPtr<unsigned_char_const>>(local_18);
    pAVar2 = Vector<kj::ArrayPtr<unsigned_char_const>>::add<kj::ArrayPtr<unsigned_char_const>>
                       ((Vector<kj::ArrayPtr<unsigned_char_const>> *)this,pAVar2);
    return pAVar2;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}